

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_2285bb9::processObjectKindVersions
          (string *__return_storage_ptr__,anon_unknown_dwarf_2285bb9 *this,cmFileAPI *fileApi,
          ObjectKind objectKind,string_view keyword,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *versions)

{
  undefined8 *puVar1;
  char *__nptr;
  bool bVar2;
  uint majorVersion;
  uint minorVersion;
  long lVar3;
  undefined4 in_register_0000000c;
  undefined8 *puVar4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a8;
  undefined8 local_90;
  size_t local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  size_t local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  puVar4 = *(undefined8 **)keyword._M_str;
  puVar1 = *(undefined8 **)((long)keyword._M_str + 8);
  if (puVar4 == puVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    bVar5 = false;
    do {
      __nptr = (char *)*puVar4;
      majorVersion = atoi(__nptr);
      lVar3 = std::__cxx11::string::find((char)puVar4,0x2e);
      minorVersion = 0;
      if (lVar3 != -1) {
        minorVersion = atoi(__nptr + lVar3 + 1);
      }
      if (((int)majorVersion < 1) || ((int)minorVersion < 0)) {
        local_a8.first._M_len = 0x1b;
        local_a8.first._M_str = "Given a malformed version \"";
        local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_88 = *puVar4;
        local_90 = puVar4[1];
        local_80 = 0;
        local_78 = 6;
        local_70 = "\" for ";
        local_68 = 0;
        local_50 = 0;
        local_48 = 1;
        local_40 = ".";
        local_38 = 0;
        views._M_len = 5;
        views._M_array = &local_a8;
        local_60 = CONCAT44(in_register_0000000c,objectKind);
        local_58 = keyword._M_len;
        cmCatViews(__return_storage_ptr__,views);
LAB_00543ee7:
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        break;
      }
      bVar2 = cmFileAPI::AddProjectQuery
                        ((cmFileAPI *)this,(ObjectKind)fileApi,majorVersion,minorVersion);
      if (bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        goto LAB_00543ee7;
      }
      puVar4 = puVar4 + 4;
      bVar5 = puVar4 == puVar1;
    } while (!bVar5);
    local_a8.first._M_len = 0x16;
    local_a8.first._M_str = "None of the specified ";
    local_a8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_80 = 0;
    local_78 = 0x30;
    local_70 = " versions is supported by this version of CMake.";
    local_68 = 0;
    views_00._M_len = 3;
    views_00._M_array = &local_a8;
    local_90 = CONCAT44(in_register_0000000c,objectKind);
    local_88 = keyword._M_len;
    cmCatViews(__return_storage_ptr__,views_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string processObjectKindVersions(cmFileAPI& fileApi,
                                      cmFileAPI::ObjectKind objectKind,
                                      cm::string_view keyword,
                                      const std::vector<std::string>& versions)
{
  // The "versions" vector is empty only when the keyword was not present.
  // It is an error to provide the keyword with no versions after it, and that
  // is enforced by the argument parser before we get here.
  if (versions.empty()) {
    return {};
  }

  // The first supported version listed is what we use
  for (const std::string& ver : versions) {
    const char* vStart = ver.c_str();
    int majorVersion = std::atoi(vStart);
    int minorVersion = 0;
    std::string::size_type pos = ver.find('.');
    if (pos != std::string::npos) {
      vStart += pos + 1;
      minorVersion = std::atoi(vStart);
    }
    if (majorVersion < 1 || minorVersion < 0) {
      return cmStrCat("Given a malformed version \"", ver, "\" for ", keyword,
                      ".");
    }
    if (fileApi.AddProjectQuery(objectKind,
                                static_cast<unsigned>(majorVersion),
                                static_cast<unsigned>(minorVersion))) {
      return {};
    }
  }
  return cmStrCat("None of the specified ", keyword,
                  " versions is supported by this version of CMake.");
}